

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O3

void __thiscall Array_Empty_Test<char>::TestBody(Array_Empty_Test<char> *this)

{
  size_t in_RCX;
  void *in_RDX;
  char *message;
  __string_type actual;
  array arr;
  AssertHelper local_90;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  internal local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  local_28;
  
  local_30 = (undefined1  [8])&PTR__array_001f2ac0;
  local_28.
  super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pstore::dump::value::write((value *)local_30,(int)this + 0x10,in_RDX,in_RCX);
  std::__cxx11::stringbuf::str();
  convert<char>(&local_70,"[ ]");
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_80,"expected","actual",&local_70,&local_50);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_array.cpp"
               ,0x37,message);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_88._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ::~vector(&local_28);
  pstore::dump::number_base::~number_base((number_base *)local_30);
  return;
}

Assistant:

TYPED_TEST (Array, Empty) {
    pstore::dump::array arr;
    arr.write (this->out);
    auto const actual = this->out.str ();
    auto const & expected = convert<TypeParam> ("[ ]");
    EXPECT_EQ (expected, actual);
}